

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

void check_leaf_list_backlinks(lyd_node *node,int op)

{
  lyd_node **pplVar1;
  lys_node *plVar2;
  lys_node *plVar3;
  lyd_node *plVar4;
  uint uVar5;
  LYS_NODE LVar6;
  ly_set *__ptr;
  LY_ERR *pLVar7;
  ulong uVar8;
  lyd_node *plVar9;
  ulong uVar10;
  
  if (2 < (uint)op) {
    __assert_fail("(op == 0) || (op == 1) || (op == 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x2ff,"void check_leaf_list_backlinks(struct lyd_node *, int)");
  }
  plVar4 = node;
  if (node == (lyd_node *)0x0) {
LAB_0015b342:
    if (node->parent != (lyd_node *)0x0) {
      node->parent->validity = '\x02';
    }
    lyd_wd_update_parents(node);
    return;
  }
  do {
    do {
      plVar9 = plVar4;
      LVar6 = plVar9->schema->nodetype;
      if ((((LVar6 & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
          (plVar2 = plVar9->schema->child, plVar2 != (lys_node *)0x0)) &&
         (*(int *)((long)&plVar2->name + 4) != 0)) {
        uVar10 = 0;
        do {
          __ptr = lyd_find_instance(plVar9,*(lys_node **)(plVar2->dsc + uVar10 * 8));
          if (__ptr == (ly_set *)0x0) {
            pLVar7 = ly_errno_location();
            *pLVar7 = LY_EINT;
            ly_log(LY_LLERR,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                   ,0x317);
            return;
          }
          uVar5 = __ptr->number;
          if (uVar5 != 0) {
            uVar8 = 0;
            do {
              plVar3 = (__ptr->set).s[uVar8];
              if (op == 0) {
joined_r0x0015b2ab:
                if ((*(ushort *)&plVar3->parent & 0x40) != 0) {
                  *(byte *)&plVar3->dsc = *(byte *)&plVar3->dsc | 4;
                }
              }
              else if ((*(ushort *)&plVar3->parent == 9) &&
                      (*(lyd_node **)&plVar3->nodetype == plVar9)) {
                *(byte *)&plVar3->dsc = *(byte *)&plVar3->dsc | 4;
                *(undefined8 *)&plVar3->nodetype = 0;
                uVar5 = __ptr->number;
              }
              else if (op != 1) goto joined_r0x0015b2ab;
              uVar8 = uVar8 + 1;
            } while (uVar8 < uVar5);
          }
          free((__ptr->set).s);
          free(__ptr);
          uVar10 = uVar10 + 1;
        } while (uVar10 < *(uint *)((long)&plVar2->name + 4));
        LVar6 = plVar9->schema->nodetype;
      }
    } while (((LVar6 & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) &&
            (plVar4 = plVar9->child, plVar9->child != (lyd_node *)0x0));
    if (plVar9 == node) goto LAB_0015b342;
    plVar4 = plVar9->next;
    if (plVar9->next == (lyd_node *)0x0) {
      plVar9 = plVar9->parent;
      do {
        if (plVar9->parent == node->parent) goto LAB_0015b342;
        pplVar1 = &plVar9->next;
        plVar4 = *pplVar1;
        plVar9 = plVar9->parent;
      } while (*pplVar1 == (lyd_node *)0x0);
    }
  } while( true );
}

Assistant:

static void
check_leaf_list_backlinks(struct lyd_node *node, int op)
{
    struct lyd_node *next, *iter;
    struct lyd_node_leaf_list *leaf_list;
    struct ly_set *set, *data;
    uint32_t i, j;

    assert((op == 0) || (op == 1) || (op == 2));

    /* fix leafrefs */
    LY_TREE_DFS_BEGIN(node, next, iter) {
        /* the node is target of a leafref */
        if ((iter->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) && iter->schema->child) {
            set = (struct ly_set *)iter->schema->child;
            for (i = 0; i < set->number; i++) {
                data = lyd_find_instance(iter, set->set.s[i]);
                if (data) {
                    for (j = 0; j < data->number; j++) {
                        leaf_list = (struct lyd_node_leaf_list *)data->set.d[j];
                        if (((op != 0) && (leaf_list->value_type == LY_TYPE_LEAFREF) && (leaf_list->value.leafref == iter))
                                || ((op != 1) && (leaf_list->value_type & LY_TYPE_LEAFREF_UNRES))) {
                            /* invalidate the leafref, a change concerning it happened */
                            leaf_list->validity |= LYD_VAL_LEAFREF;
                            if (leaf_list->value_type == LY_TYPE_LEAFREF) {
                                /* remove invalid link */
                                leaf_list->value.leafref = NULL;
                            }
                        }
                    }
                    ly_set_free(data);
                } else {
                    LOGINT;
                    return;
                }
            }
        }
        LY_TREE_DFS_END(node, next, iter)
    }

    /* invalidate parent to make sure it will be checked in future validation */
    if (node->parent) {
        node->parent->validity = LYD_VAL_MAND;
    }

    /* update parent's default flag if needed */
    lyd_wd_update_parents(node);
}